

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_aws_sigv4.c
# Opt level: O2

CURLcode canon_string(char *q,size_t len,dynbuf *dq,_Bool *found_equals)

{
  byte bVar1;
  size_t sVar2;
  ulong uVar3;
  char cVar4;
  CURLcode CVar5;
  uint uVar6;
  ulong in_RAX;
  byte *pbVar7;
  char *mem;
  size_t sStack_40;
  char tmp [3];
  uchar out [3];
  undefined5 uStack_35;
  
  CVar5 = CURLE_OK;
  sVar2 = 1;
  _tmp = in_RAX;
  do {
    if ((len == 0) || (CVar5 != CURLE_OK)) {
      return CVar5;
    }
    bVar1 = *q;
    sStack_40 = sVar2;
    mem = q;
    pbVar7 = (byte *)q;
    if ((((byte)(bVar1 - 0x30) < 10) || ((byte)((bVar1 & 0xdf) + 0xbf) < 0x1a)) ||
       (bVar1 - 0x2d < 2)) {
LAB_001392cb:
      CVar5 = Curl_dyn_addn(dq,mem,sStack_40);
    }
    else {
      if (bVar1 != 0x25) {
        if ((bVar1 != 0x7e) && (bVar1 != 0x5f)) {
          uVar3 = _tmp >> 0x30;
          _tmp = CONCAT24(0x25,_tmp);
          _tmp = CONCAT26((short)uVar3,_tmp) & 0xff00ffffffffffff;
          bVar1 = *q;
          if (found_equals == (_Bool *)0x0) {
            if (bVar1 == 0x2f) goto LAB_001392cb;
          }
          else if (bVar1 == 0x3d) {
            CVar5 = Curl_dyn_addn(dq,q,1);
            *found_equals = true;
            goto LAB_001392d0;
          }
          Curl_hexbyte(out + 1,bVar1,false);
          mem = (char *)out;
          goto LAB_001393c4;
        }
        goto LAB_001392cb;
      }
      if (((9 < (byte)(((byte *)q)[1] - 0x30)) &&
          ((uVar6 = ((byte *)q)[1] - 0x41, 0x25 < uVar6 ||
           ((0x3f0000003fU >> ((ulong)uVar6 & 0x3f) & 1) == 0)))) ||
         ((9 < (byte)(((byte *)q)[2] - 0x30) &&
          ((uVar6 = ((byte *)q)[2] - 0x41, 0x25 < uVar6 ||
           ((0x3f0000003fU >> ((ulong)uVar6 & 0x3f) & 1) == 0)))))) {
        mem = "%25";
LAB_001393c4:
        sStack_40 = 3;
        goto LAB_001392cb;
      }
      pbVar7 = (byte *)q + 2;
      stack0xffffffffffffffca = (uint6)(_tmp >> 0x10) & 0xffffffffff00;
      _tmp = CONCAT62(stack0xffffffffffffffca,0x25);
      cVar4 = Curl_raw_toupper(((byte *)q)[1]);
      tmp._0_2_ = CONCAT11(cVar4,tmp[0]);
      cVar4 = Curl_raw_toupper(((byte *)q)[2]);
      tmp = (char  [3])CONCAT12(cVar4,tmp._0_2_);
      CVar5 = Curl_dyn_addn(dq,tmp,3);
      len = len - 2;
    }
LAB_001392d0:
    q = (char *)(pbVar7 + 1);
    len = len - 1;
  } while( true );
}

Assistant:

static CURLcode canon_string(const char *q, size_t len,
                             struct dynbuf *dq, bool *found_equals)
{
  CURLcode result = CURLE_OK;

  for(; len && !result; q++, len--) {
    if(ISALNUM(*q))
      result = Curl_dyn_addn(dq, q, 1);
    else {
      switch(*q) {
      case '-':
      case '.':
      case '_':
      case '~':
        /* allowed as-is */
        result = Curl_dyn_addn(dq, q, 1);
        break;
      case '%':
        /* uppercase the following if hexadecimal */
        if(ISXDIGIT(q[1]) && ISXDIGIT(q[2])) {
          char tmp[3]="%";
          tmp[1] = Curl_raw_toupper(q[1]);
          tmp[2] = Curl_raw_toupper(q[2]);
          result = Curl_dyn_addn(dq, tmp, 3);
          q += 2;
          len -= 2;
        }
        else
          /* '%' without a following two-digit hex, encode it */
          result = Curl_dyn_addn(dq, "%25", 3);
        break;
      default: {
        unsigned char out[3]={'%'};

        if(!found_equals) {
          /* if found_equals is NULL assuming, been in path */
          if(*q == '/') {
            /* allowed as if */
            result = Curl_dyn_addn(dq, q, 1);
            break;
          }
        }
        else {
          /* allowed as-is */
          if(*q == '=') {
            result = Curl_dyn_addn(dq, q, 1);
            *found_equals = TRUE;
            break;
          }
        }
        /* URL encode */
        Curl_hexbyte(&out[1], *q, FALSE);
        result = Curl_dyn_addn(dq, out, 3);
        break;
      }
      }
    }
  }
  return result;
}